

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void AdditionHelper<unsigned_char,long,9>::
     AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (uchar *lhs,long *rhs,uchar *result)

{
  byte bVar1;
  ulong uVar2;
  code *pcVar3;
  byte bVar4;
  char *in_RDX;
  ulong *in_RSI;
  byte *in_RDI;
  uint64_t tmp;
  
  if ((long)*in_RSI < 0) {
    if ((ulong)*in_RDI < (*in_RSI ^ 0xffffffffffffffff) + 1) {
LAB_00194a24:
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    if (SCARRY8((ulong)*in_RDI,*in_RSI)) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *in_RDX = *in_RDI + (char)*in_RSI;
  }
  else {
    bVar1 = *in_RDI;
    uVar2 = *in_RSI;
    bVar4 = std::numeric_limits<unsigned_char>::max();
    if ((ulong)bVar4 < bVar1 + uVar2) goto LAB_00194a24;
    *in_RDX = (char)(bVar1 + uVar2);
  }
  return;
}

Assistant:

TestVector() : test_cases(nullptr), count(0), current(0) {}